

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_hdr_set_samples(bcf_hdr_t *hdr,char *samples,int is_file)

{
  bcf_idinfo_t *pbVar1;
  uint *__ptr;
  bcf_idinfo_t *pbVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  khint_t kVar6;
  uint8_t *puVar7;
  char **__ptr_00;
  char *pcVar8;
  kh_vdict_t *h;
  byte bVar9;
  uint uVar10;
  int iVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  int n;
  int ignore;
  int local_44;
  char **local_40;
  int local_34;
  
  if (samples == (char *)0x0) {
    hdr->nsamples_ori = hdr->n[2];
    hdr->n[2] = 0;
  }
  else {
    uVar3 = (byte)*samples - 0x2d;
    if (uVar3 == 0) {
      uVar3 = (uint)(byte)samples[1];
    }
    if (uVar3 != 0) {
      iVar11 = hdr->n[2];
      iVar5 = iVar11 + 7;
      if (-1 < iVar11) {
        iVar5 = iVar11;
      }
      hdr->nsamples_ori = iVar11;
      uVar14 = 1;
      puVar7 = (uint8_t *)calloc((long)((iVar5 >> 3) + 1),1);
      hdr->keep_samples = puVar7;
      if (*samples == '^') {
        if (0 < iVar11) {
          uVar3 = 0;
          do {
            hdr->keep_samples[uVar3 >> 3] =
                 hdr->keep_samples[uVar3 >> 3] | (byte)(1 << ((byte)uVar3 & 7));
            uVar3 = uVar3 + 1;
          } while ((int)uVar3 < hdr->n[2]);
          uVar14 = (ulong)(*samples == '^');
        }
      }
      else {
        uVar14 = 0;
      }
      __ptr_00 = hts_readlist(samples + uVar14,is_file,&local_44);
      if (__ptr_00 != (char **)0x0) {
        if (local_44 < 1) {
          iVar11 = 0;
        }
        else {
          lVar13 = 0;
          iVar5 = 0;
          iVar11 = 0;
          do {
            uVar3 = bcf_hdr_id2int(hdr,2,__ptr_00[lVar13]);
            if ((int)uVar3 < 0) {
              iVar4 = (int)lVar13 + 1;
              bVar15 = iVar11 == 0;
              iVar11 = iVar5;
              if (bVar15) {
                iVar11 = iVar4;
                iVar5 = iVar4;
              }
            }
            else {
              if (hdr->n[2] <= (int)uVar3) {
                __assert_fail("idx<bcf_hdr_nsamples(hdr)",
                              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                              ,0x9a6,"int bcf_hdr_set_samples(bcf_hdr_t *, const char *, int)");
              }
              bVar12 = hdr->keep_samples[uVar3 >> 3];
              bVar9 = (byte)(1 << ((byte)uVar3 & 7));
              if (*samples == '^') {
                bVar12 = bVar12 & ~bVar9;
              }
              else {
                bVar12 = bVar12 | bVar9;
              }
              hdr->keep_samples[uVar3 >> 3] = bVar12;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < local_44);
          if (0 < local_44) {
            lVar13 = 0;
            do {
              free(__ptr_00[lVar13]);
              lVar13 = lVar13 + 1;
            } while (lVar13 < local_44);
          }
        }
        free(__ptr_00);
        hdr->n[2] = 0;
        uVar3 = hdr->nsamples_ori;
        if (0 < (long)(int)uVar3) {
          puVar7 = hdr->keep_samples;
          iVar5 = 0;
          uVar10 = 0;
          do {
            if ((puVar7[uVar10 >> 3] >> (uVar10 & 7) & 1) != 0) {
              iVar5 = iVar5 + 1;
              hdr->n[2] = iVar5;
            }
            uVar10 = uVar10 + 1;
          } while (uVar3 != uVar10);
          if (iVar5 != 0) {
            local_40 = (char **)malloc((long)iVar5 << 3);
            if (0 < (int)uVar3) {
              puVar7 = hdr->keep_samples;
              uVar14 = 0;
              iVar5 = 0;
              do {
                if ((puVar7[uVar14 >> 3 & 0x1fffffff] >> ((uint)uVar14 & 7) & 1) != 0) {
                  pcVar8 = strdup(hdr->samples[uVar14]);
                  lVar13 = (long)iVar5;
                  iVar5 = iVar5 + 1;
                  local_40[lVar13] = pcVar8;
                }
                uVar14 = uVar14 + 1;
              } while ((long)(int)uVar3 != uVar14);
            }
            free(hdr->samples);
            hdr->samples = local_40;
            __ptr = (uint *)hdr->dict[2];
            uVar3 = *__ptr;
            if (uVar3 != 0) {
              bVar12 = 0;
              uVar14 = 0;
              do {
                if ((*(uint *)(*(long *)(__ptr + 4) + (uVar14 >> 4 & 0xfffffff) * 4) >>
                     (bVar12 & 0x1e) & 3) == 0) {
                  free(*(void **)(*(long *)(__ptr + 6) + uVar14 * 8));
                  uVar3 = *__ptr;
                }
                uVar14 = uVar14 + 1;
                bVar12 = bVar12 + 2;
              } while (uVar14 != uVar3);
            }
            free(*(void **)(__ptr + 6));
            free(*(void **)(__ptr + 4));
            free(*(void **)(__ptr + 8));
            free(__ptr);
            h = (kh_vdict_t *)calloc(1,0x28);
            hdr->dict[2] = h;
            if (0 < hdr->n[2]) {
              lVar13 = 0;
              do {
                kVar6 = kh_put_vdict(h,hdr->samples[lVar13],&local_34);
                pbVar2 = h->vals;
                pbVar1 = pbVar2 + (int)kVar6;
                pbVar1->info[0] = 0xf;
                pbVar1->info[1] = 0xf;
                *(undefined8 *)(pbVar1->info + 2) = 0xf;
                pbVar2[(int)kVar6].hrec[0] = (bcf_hrec_t *)0x0;
                pbVar2[(int)kVar6].hrec[1] = (bcf_hrec_t *)0x0;
                pbVar2[(int)kVar6].hrec[2] = (bcf_hrec_t *)0x0;
                (pbVar2[(int)kVar6].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
                pbVar2[(int)kVar6].id = h->size - 1;
                lVar13 = lVar13 + 1;
              } while (lVar13 < hdr->n[2]);
            }
            bcf_hdr_sync(hdr);
            return iVar11;
          }
        }
        free(hdr->keep_samples);
        hdr->keep_samples = (uint8_t *)0x0;
        return iVar11;
      }
      return -1;
    }
  }
  return 0;
}

Assistant:

int bcf_hdr_set_samples(bcf_hdr_t *hdr, const char *samples, int is_file)
{
    if ( samples && !strcmp("-",samples) ) return 0;            // keep all samples

    hdr->nsamples_ori = bcf_hdr_nsamples(hdr);
    if ( !samples ) { bcf_hdr_nsamples(hdr) = 0; return 0; }    // exclude all samples

    int i, narr = bit_array_size(bcf_hdr_nsamples(hdr));
    hdr->keep_samples = (uint8_t*) calloc(narr,1);
    if ( samples[0]=='^' )
        for (i=0; i<bcf_hdr_nsamples(hdr); i++) bit_array_set(hdr->keep_samples,i);

    int idx, n, ret = 0;
    char **smpls = hts_readlist(samples[0]=='^'?samples+1:samples, is_file, &n);
    if ( !smpls ) return -1;
    for (i=0; i<n; i++)
    {
        idx = bcf_hdr_id2int(hdr,BCF_DT_SAMPLE,smpls[i]);
        if ( idx<0 )
        {
            if ( !ret ) ret = i+1;
            continue;
        }
        assert( idx<bcf_hdr_nsamples(hdr) );
        if (  samples[0]=='^' )
            bit_array_clear(hdr->keep_samples, idx);
        else
            bit_array_set(hdr->keep_samples, idx);
    }
    for (i=0; i<n; i++) free(smpls[i]);
    free(smpls);

    bcf_hdr_nsamples(hdr) = 0;
    for (i=0; i<hdr->nsamples_ori; i++)
        if ( bit_array_test(hdr->keep_samples,i) ) bcf_hdr_nsamples(hdr)++;
    if ( !bcf_hdr_nsamples(hdr) ) { free(hdr->keep_samples); hdr->keep_samples=NULL; }
    else
    {
        char **samples = (char**) malloc(sizeof(char*)*bcf_hdr_nsamples(hdr));
        idx = 0;
        for (i=0; i<hdr->nsamples_ori; i++)
            if ( bit_array_test(hdr->keep_samples,i) ) samples[idx++] = strdup(hdr->samples[i]);
        free(hdr->samples);
        hdr->samples = samples;

        // delete original samples from the dictionary
        vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_SAMPLE];
        int k;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
        kh_destroy(vdict, d);

        // add the subset back
        hdr->dict[BCF_DT_SAMPLE] = d = kh_init(vdict);
        for (i=0; i<bcf_hdr_nsamples(hdr); i++)
        {
            int ignore, k = kh_put(vdict, d, hdr->samples[i], &ignore);
            kh_val(d, k) = bcf_idinfo_def;
            kh_val(d, k).id = kh_size(d) - 1;
        }
        bcf_hdr_sync(hdr);
    }

    return ret;
}